

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

void __thiscall
sqlite_orm::internal::storage_impl<$96322bb6$>::add_column
          (storage_impl<_96322bb6_> *this,table_info *ti,sqlite3 *db)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  system_error *psVar4;
  error_category *peVar5;
  char *pcVar6;
  error_code __ec;
  error_code __ec_00;
  sqlite3_stmt *stmt;
  __string_type query;
  stringstream ss;
  undefined8 local_1d8;
  long *local_1d0;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"ALTER TABLE ",0xc);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(this->table).super_table_base.name._M_dataplus._M_p,
                      (this->table).super_table_base.name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ADD COLUMN ",0xc);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(ti->name)._M_dataplus._M_p,(ti->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(ti->type)._M_dataplus._M_p,(ti->type)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if (ti->pk != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"PRIMARY KEY ",0xc);
  }
  if (ti->notnull == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"NOT NULL ",9);
  }
  if ((ti->dflt_value)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"DEFAULT ",8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(ti->dflt_value)._M_dataplus._M_p,
                        (ti->dflt_value)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  }
  std::__cxx11::stringbuf::str();
  iVar1 = sqlite3_prepare_v2(db,local_1d0,0xffffffff,&local_1d8,0);
  if (iVar1 == 0) {
    iVar1 = sqlite3_step(local_1d8);
    if (iVar1 == 0x65) {
      sqlite3_finalize(local_1d8);
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0,local_1c0[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1b0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
      return;
    }
    psVar4 = (system_error *)__cxa_allocate_exception(0x20);
    uVar2 = sqlite3_errcode(db);
    peVar5 = &get_sqlite_error_category()->super_error_category;
    pcVar6 = (char *)sqlite3_errmsg(db);
    __ec_00._4_4_ = 0;
    __ec_00._M_value = uVar2;
    __ec_00._M_cat = peVar5;
    std::system_error::system_error(psVar4,__ec_00,pcVar6);
    __cxa_throw(psVar4,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  psVar4 = (system_error *)__cxa_allocate_exception(0x20);
  uVar2 = sqlite3_errcode(db);
  peVar5 = &get_sqlite_error_category()->super_error_category;
  pcVar6 = (char *)sqlite3_errmsg(db);
  __ec._4_4_ = 0;
  __ec._M_value = uVar2;
  __ec._M_cat = peVar5;
  std::system_error::system_error(psVar4,__ec,pcVar6);
  __cxa_throw(psVar4,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void add_column(const table_info &ti, sqlite3 *db) const {
        std::stringstream ss;
        ss << "ALTER TABLE " << this->table.name << " ADD COLUMN " << ti.name << " ";
        ss << ti.type << " ";
        if(ti.pk) {
            ss << "PRIMARY KEY ";
        }
        if(ti.notnull) {
            ss << "NOT NULL ";
        }
        if(ti.dflt_value.length()) {
            ss << "DEFAULT " << ti.dflt_value << " ";
        }
        auto query = ss.str();
        sqlite3_stmt *stmt;
        auto prepareResult = sqlite3_prepare_v2(db, query.c_str(), -1, &stmt, nullptr);
        if(prepareResult == SQLITE_OK) {
            statement_finalizer finalizer{stmt};
            if(sqlite3_step(stmt) == SQLITE_DONE) {
                //..
            } else {
                throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                        sqlite3_errmsg(db));
            }
        } else {
            throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                    sqlite3_errmsg(db));
        }
    }